

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaLookups.cpp
# Opt level: O2

void testToNonlinear(void)

{
  int iVar1;
  float __x;
  float fVar2;
  unsigned_short usXdr;
  unsigned_short usNative;
  char *tmp;
  undefined2 local_44;
  ushort local_42;
  double local_40;
  undefined2 *local_38;
  
  for (iVar1 = -0xffff; iVar1 != 0; iVar1 = iVar1 + 1) {
    local_44 = (undefined2)iVar1;
    local_38 = &local_44;
    Imf_3_2::Xdr::read<Imf_3_2::CharPtrIO,char_const*>((char **)&local_38,&local_42);
    if ((~local_42 & 0x7c00) != 0) {
      fVar2 = *(float *)(_imath_half_to_float_table + (ulong)local_42 * 4);
      __x = ABS(fVar2);
      if (__x <= 1.0) {
        local_40 = (double)CONCAT44(local_40._4_4_,
                                    *(float *)(&DAT_0019e178 + (ulong)(fVar2 < 0.0) * 4));
        fVar2 = powf(__x,0.45454544);
        fVar2 = fVar2 * local_40._0_4_;
      }
      else {
        local_40 = (double)*(float *)(&DAT_0019e178 + (ulong)(fVar2 < 0.0) * 4);
        fVar2 = logf(__x);
        fVar2 = (float)(((double)(fVar2 / 2.2) + 1.0) * local_40);
      }
      Imath_3_2::half::half((half *)&local_38,fVar2);
    }
  }
  puts("test dwaCompressorToNonlinear[]");
  return;
}

Assistant:

void
testToNonlinear ()
{
    unsigned short toNonlinear[65536];

    toNonlinear[0] = 0;

    for (int i = 1; i < 65536; ++i)
    {
        unsigned short usNative, usXdr;
        half           h;
        float          sign    = 1;
        float          logBase = pow (2.7182818, 2.2);

        usXdr = i;

        {
            const char* tmp = (char*) (&usXdr);

            Xdr::read<CharPtrIO> (tmp, usNative);
        }

        // map  NaN and inf to 0
        if ((usNative & 0x7c00) == 0x7c00)
        {
            toNonlinear[i] = 0;
            continue;
        }

        //
        // toNonlinear - assume i is XDR
        //
        h.setBits (usNative);
        sign = 1;
        if ((float) h < 0) { sign = -1; }

        if (fabs ((float) h) <= 1.0)
        {
            h = (half) (sign * pow (fabs ((float) h), 1.f / 2.2f));
        }
        else
        {
            h = (half) (sign * (log (fabs ((float) h)) / log (logBase) + 1.0));
        }
        toNonlinear[i] = h.bits ();
    }

    printf ("test dwaCompressorToNonlinear[]\n");
    for (int i = 0; i < 65536; ++i)
        assert (
            toNonlinear[i] ==
            OPENEXR_IMF_INTERNAL_NAMESPACE::dwaCompressorToNonlinear[i]);
}